

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus_allowed.c
# Opt level: O2

cpu_set_t * cpus_allowed(size_t *setsize,int *maxcpu)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *__s;
  size_t sVar4;
  cpu_set_t *pcVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  __s = status_entry("Cpus_allowed");
  if (__s != (char *)0x0) {
    pcVar5 = (cpu_set_t *)0x0;
    if (*__s == '\0') goto LAB_00220402;
    sVar4 = strlen(__s);
    iVar8 = -1;
    while( true ) {
      sVar4 = sVar4 - 1;
      if ((int)(uint)sVar4 < 0) break;
      cVar1 = __s[(uint)sVar4 & 0x7fffffff];
      if ((0xf5 < (byte)(cVar1 - 0x3aU)) || (0xf9 < (byte)(cVar1 + 0x99U))) {
        uVar2 = hex2int(cVar1);
        if (uVar2 != 0) {
          iVar7 = 4;
          if (uVar2 < 8) {
            iVar7 = 3;
            if (uVar2 < 4) {
              iVar7 = (uVar2 != 1) + 1;
            }
          }
          iVar7 = iVar7 + (int)pcVar5;
          if (iVar8 < iVar7) {
            iVar8 = iVar7;
          }
        }
        pcVar5 = (cpu_set_t *)(ulong)((int)pcVar5 + 4);
      }
    }
    *maxcpu = iVar8;
    if (iVar8 != -1) {
      pcVar5 = __sched_cpualloc((long)(iVar8 + 1));
      uVar2 = 0;
      if (pcVar5 != (cpu_set_t *)0x0) {
        uVar9 = (long)*maxcpu + 0x40U >> 3 & 0xfffffffffffffff8;
        *setsize = uVar9;
        sVar4 = strlen(__s);
        while( true ) {
          sVar4 = sVar4 - 1;
          if ((int)(uint)sVar4 < 0) break;
          cVar1 = __s[(uint)sVar4 & 0x7fffffff];
          if ((0xf5 < (byte)(cVar1 - 0x3aU)) || (0xf9 < (byte)(cVar1 + 0x99U))) {
            uVar3 = hex2int(cVar1);
            bVar6 = (byte)uVar2;
            if (((uVar3 & 1) != 0) && (uVar2 >> 3 < uVar9)) {
              pcVar5->__bits[uVar2 >> 6] = pcVar5->__bits[uVar2 >> 6] | 1L << (bVar6 & 0x3c);
            }
            if (((uVar3 & 2) != 0) && (uVar2 >> 3 < uVar9)) {
              pcVar5->__bits[uVar2 >> 6] = pcVar5->__bits[uVar2 >> 6] | 1L << (bVar6 & 0x3d | 1);
            }
            if (((uVar3 & 4) != 0) && (uVar2 >> 3 < uVar9)) {
              pcVar5->__bits[uVar2 >> 6] = pcVar5->__bits[uVar2 >> 6] | 1L << (bVar6 & 0x3e | 2);
            }
            if ((7 < uVar3) && (uVar2 >> 3 < uVar9)) {
              pcVar5->__bits[uVar2 >> 6] = pcVar5->__bits[uVar2 >> 6] | 1L << (bVar6 & 0x3f | 3);
            }
            uVar2 = uVar2 + 4;
          }
        }
        goto LAB_00220402;
      }
    }
  }
  pcVar5 = (cpu_set_t *)0x0;
LAB_00220402:
  free(__s);
  return (cpu_set_t *)pcVar5;
}

Assistant:

cpu_set_t *
cpus_allowed(size_t *setsize, int *maxcpu)
{
	cpu_set_t *c = NULL;
	char *allowed = status_entry("Cpus_allowed");
	if (!allowed || strlen(allowed) == 0)
		goto done;
	*maxcpu = high_bit_order(allowed);
	if (*maxcpu == -1)
		goto done;
	c = CPU_ALLOC(*maxcpu+1);
	if (!c)
		goto done;
	*setsize = CPU_ALLOC_SIZE(*maxcpu+1);
	set_cpu_bits(allowed, c, *setsize);
done:
	free(allowed);
	return c;
}